

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCpBcc<(moira::Instr)147,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  char cVar8;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    dasmIllegal<(moira::Instr)147,(moira::Mode)12,2>(this,str,addr,op);
    return;
  }
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar3 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  iVar4 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  iVar5 = (*this->_vptr_Moira[6])(this);
  s = &str->ptr;
  sprintd_signed(s,(ulong)(op >> 9 & 7));
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = 'b';
  StrWriter::operator<<(str,(Cpcc)(op & 0x3f));
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar6 = *s;
    *s = pcVar6 + 1;
    *pcVar6 = ' ';
    pcVar6 = *s;
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar6 = str->ptr;
    do {
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
      pcVar6 = str->ptr;
    } while (pcVar6 < str->base + iVar2);
  }
  str->ptr = pcVar6 + 1;
  *pcVar6 = '#';
  StrWriter::operator<<(str,(Int)(int)(short)iVar5);
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ';';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
  StrWriter::operator<<(str,(UInt)(uVar1 + (int)(short)iVar4 + 2));
  cVar8 = ' ';
  lVar7 = 1;
  do {
    pcVar6 = *s;
    *s = pcVar6 + 1;
    *pcVar6 = cVar8;
    cVar8 = "; (extension = "[lVar7 + 1];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xf);
  StrWriter::operator<<(str,(Int)(uVar3 & 0xffff));
  cVar8 = ')';
  lVar7 = 1;
  do {
    pcVar6 = *s;
    *s = pcVar6 + 1;
    *pcVar6 = cVar8;
    cVar8 = "%ds%-4s  %s; (extension = $%x) (2-3)"[lVar7 + 0x1d];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  return;
}

Assistant:

void
Moira::dasmCpBcc(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto id   = ( ____xxx_________(op) );
    auto cnd  = ( __________xxxxxx(op) );
    auto pc   = addr + 2;
    auto ext1 = dasmIncRead<Word>(addr);
    auto disp = dasmIncRead<S>(addr);
    auto ext2 = dasmIncRead<Word>(addr);

    pc += SEXT<S>(disp);

    str << id << Ins<I>{} << Cpcc{cnd} << str.tab << Ims<Word>(ext2);
    str << "; " << UInt(pc) << " (extension = " << Int(ext1) << ") (2-3)";
}